

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

_Bool duckdb_je_emap_register_boundary
                (tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind,_Bool slab)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  rtree_ctx_t *ctx;
  rtree_leaf_elm_t *elm_b;
  rtree_leaf_elm_t *elm_a;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  _Var1 = emap_rtree_leaf_elms_lookup(tsdn,emap,ctx,edata,false,true,&elm_a,&elm_b);
  if (!_Var1) {
    if (edata == (edata_t *)0x0) {
      uVar2 = 0;
      uVar3 = 0;
    }
    else {
      uVar2 = (ulong)((uint)(edata->e_bits >> 0x2b) & 2);
      uVar3 = (ulong)((uint)(edata->e_bits >> 0xf) & 0x1c);
    }
    pvVar4 = (void *)(slab | uVar2 | (ulong)szind << 0x30 | uVar3 | (ulong)edata & 0xffffffffffff);
    (elm_a->le_bits).repr = pvVar4;
    if (elm_b != (rtree_leaf_elm_t *)0x0) {
      (elm_b->le_bits).repr = pvVar4;
    }
  }
  return _Var1;
}

Assistant:

bool
emap_register_boundary(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    szind_t szind, bool slab) {
	assert(edata_state_get(edata) == extent_state_active);
	EMAP_DECLARE_RTREE_CTX;

	rtree_leaf_elm_t *elm_a, *elm_b;
	bool err = emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, edata,
	    false, true, &elm_a, &elm_b);
	if (err) {
		return true;
	}
	assert(rtree_leaf_elm_read(tsdn, &emap->rtree, elm_a,
	    /* dependent */ false).edata == NULL);
	assert(rtree_leaf_elm_read(tsdn, &emap->rtree, elm_b,
	    /* dependent */ false).edata == NULL);
	emap_rtree_write_acquired(tsdn, emap, elm_a, elm_b, edata, szind, slab);
	return false;
}